

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O3

LibraryHandle cmDynamicLoader::OpenLibrary(char *libname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LibraryHandle pvVar3;
  iterator __position;
  mapped_type *ppvVar4;
  LibraryHandle *in_RDX;
  LibraryHandle *extraout_RDX;
  LibraryHandle *extraout_RDX_00;
  LibraryHandle *p;
  LibraryHandle h;
  allocator<char> local_51;
  string local_50;
  LibraryHandle local_30;
  allocator<char> local_28 [8];
  
  bVar2 = anon_unknown.dwarf_7fcb86::cmDynamicLoaderCache::GetCacheFile
                    ((cmDynamicLoaderCache *)libname,(char *)&local_30,in_RDX);
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,libname,local_28);
    pvVar3 = cmsys::DynamicLoader::OpenLibrary(&local_50);
    paVar1 = &local_50.field_2;
    p = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      p = extraout_RDX_00;
    }
    bVar2 = anon_unknown.dwarf_7fcb86::cmDynamicLoaderCache::GetCacheFile
                      ((cmDynamicLoaderCache *)libname,(char *)local_28,p);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,libname,&local_51);
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                           *)(anonymous_namespace)::cmDynamicLoaderCache::Instance,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (__position._M_node !=
          (_Base_ptr)((anonymous_namespace)::cmDynamicLoaderCache::Instance + 8)) {
        cmsys::DynamicLoader::CloseLibrary(*(LibraryHandle *)(__position._M_node + 2));
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void*>,std::_Select1st<std::pair<std::__cxx11::string_const,void*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void*>,std::_Select1st<std::pair<std::__cxx11::string_const,void*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
                            *)(anonymous_namespace)::cmDynamicLoaderCache::Instance,__position);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,libname,&local_51);
    ppvVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                            *)(anonymous_namespace)::cmDynamicLoaderCache::Instance,&local_50);
    *ppvVar4 = pvVar3;
    local_30 = pvVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return local_30;
}

Assistant:

cmsys::DynamicLoader::LibraryHandle cmDynamicLoader::OpenLibrary(
  const char* libname)
{
  cmsys::DynamicLoader::LibraryHandle lh;
  if (cmDynamicLoaderCache::GetInstance().GetCacheFile(libname, lh)) {
    return lh;
  }
  lh = cmsys::DynamicLoader::OpenLibrary(libname);
  cmDynamicLoaderCache::GetInstance().CacheFile(libname, lh);
  return lh;
}